

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

LessThanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_lessthan(NeuralNetworkLayer *this)

{
  LessThanLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x339) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x339;
    this_00 = (LessThanLayerParams *)operator_new(0x18);
    LessThanLayerParams::LessThanLayerParams(this_00);
    (this->layer_).lessthan_ = this_00;
  }
  return (LessThanLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LessThanLayerParams* NeuralNetworkLayer::mutable_lessthan() {
  if (!has_lessthan()) {
    clear_layer();
    set_has_lessthan();
    layer_.lessthan_ = new ::CoreML::Specification::LessThanLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.lessThan)
  return layer_.lessthan_;
}